

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void export_token_to_json
               (DString *out,simple_token *t,char *source,int lev,stack *s,_Bool array_out)

{
  char cVar1;
  DString *ripString;
  size_t sVar2;
  int iVar3;
  simple_token *psVar4;
  char *pcVar5;
  simple_token *t_00;
  
  if (t == (simple_token *)0x0) {
    return;
  }
  switch(t->type) {
  case 0:
    d_string_append_c_array(out,"[\n",2);
    psVar4 = t->child;
    if (psVar4 != (simple_token *)0x0) {
      do {
        export_token_to_json(out,psVar4,source,lev + 1,s,array_out);
        psVar4 = psVar4->next;
      } while (psVar4 != (simple_token *)0x0);
    }
    pcVar5 = "]\n";
    break;
  case 1:
  case 5:
  case 7:
    pcVar5 = source + t->start;
    sVar2 = t->len;
    goto LAB_00109c5a;
  case 2:
    cVar1 = source[t->start];
    switch(cVar1) {
    case '\b':
      pcVar5 = "\\b";
      break;
    case '\t':
      pcVar5 = "\\t";
      break;
    case '\n':
      goto switchD_001099df_caseD_a;
    case '\v':
switchD_00109881_caseD_68:
      return;
    case '\f':
      pcVar5 = "\\f";
      break;
    case '\r':
      pcVar5 = "\\r";
      break;
    default:
      if (cVar1 == '\"') goto switchD_00109847_caseD_6;
      if (cVar1 != '\\') {
        return;
      }
      pcVar5 = "\\\\";
    }
    break;
  case 3:
    if ((source[t->start] != '\r') && (source[t->start] != '\n')) {
      return;
    }
switchD_001099df_caseD_a:
    pcVar5 = "\\n";
    break;
  case 4:
switchD_00109847_caseD_4:
    fprintf(_stderr,"Error parsing token type %d\n");
    return;
  case 6:
switchD_00109847_caseD_6:
    pcVar5 = "\\\"";
    break;
  default:
    switch(t->type) {
    case 100:
      for (psVar4 = t->child; psVar4 != (simple_token *)0x0; psVar4 = psVar4->next) {
        ripString = d_string_new("");
        for (t_00 = psVar4->child; t_00 != (simple_token *)0x0; t_00 = t_00->next) {
          export_token_to_json(ripString,t_00,source,0,s,array_out);
        }
        stack_push(s,ripString->str);
        d_string_free(ripString,false);
      }
      if (!array_out) {
        return;
      }
      pcVar5 = "[\n";
      iVar3 = lev;
      if (0 < lev) {
        do {
          d_string_append_c_array(out,"\t",1);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      break;
    case 0x65:
      iVar3 = lev;
      if (0 < lev) {
        do {
          d_string_append_c_array(out,"\t",1);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      pcVar5 = "{\n";
      if (array_out) {
        pcVar5 = "[\n";
      }
      break;
    case 0x66:
      d_string_append_c_array(out,"\"",1);
      for (psVar4 = t->child; psVar4 != (simple_token *)0x0; psVar4 = psVar4->next) {
        export_token_to_json(out,psVar4,source,lev,s,array_out);
      }
      d_string_append_c_array(out,"\"",1);
      goto LAB_00109bf2;
    case 0x67:
      for (psVar4 = t->child; psVar4 != (simple_token *)0x0; psVar4 = psVar4->next) {
        export_token_to_json(out,psVar4,source,lev,s,array_out);
      }
LAB_00109bf2:
      if ((t->next == (simple_token *)0x0) || ((t->next->type & 0xfffe) != 0x66)) goto LAB_00109c15;
      goto LAB_00109c0c;
    case 0x68:
      goto switchD_00109881_caseD_68;
    default:
      goto switchD_00109847_caseD_4;
    }
    d_string_append_c_array(out,pcVar5,2);
    psVar4 = t->child;
    if (psVar4 != (simple_token *)0x0) {
      sVar2 = 0;
      do {
        iVar3 = lev + 1;
        if (-1 < lev) {
          do {
            d_string_append_c_array(out,"\t",1);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        if (!array_out) {
          d_string_append_c_array(out,"\"",1);
          pcVar5 = (char *)stack_peek_index(s,sVar2);
          d_string_append(out,pcVar5);
          d_string_append_c_array(out,"\": ",3);
        }
        export_token_to_json(out,psVar4,source,lev,s,array_out);
        sVar2 = sVar2 + 1;
        psVar4 = psVar4->next;
      } while (psVar4 != (simple_token *)0x0);
    }
    if (0 < lev) {
      do {
        d_string_append_c_array(out,"\t",1);
        lev = lev + -1;
      } while (lev != 0);
    }
    pcVar5 = "}";
    if (array_out) {
      pcVar5 = "]";
    }
    d_string_append_c_array(out,pcVar5,1);
    if ((t->next == (simple_token *)0x0) || (t->next->type != 0x65)) {
LAB_00109c15:
      pcVar5 = "\n";
      sVar2 = 1;
      goto LAB_00109c5a;
    }
LAB_00109c0c:
    pcVar5 = ",\n";
  }
  sVar2 = 2;
LAB_00109c5a:
  d_string_append_c_array(out,pcVar5,sVar2);
  return;
}

Assistant:

void export_token_to_json(DString * out, simple_token * t, const char * source, int lev, stack * s, bool array_out) {
	DString * header;
	int count = 0;
	char * text;
	simple_token * c;

	if (t) {
		switch (t->type) {
			case 0:
				print_const("[\n");
				export_token_tree_to_json(out, t->child, source, lev + 1, s, array_out);
				print_const("]\n");
				break;

			case TDP_HEADER:
				c = t->child;

				while (c) {
					header = d_string_new("");
					export_token_tree_to_json(header, c->child, source, 0, s, array_out);
					stack_push(s, header->str);
					d_string_free(header, false);
					c = c->next;
				}

				if (!array_out) {
					break;
				}

			case TDP_RECORD:
				indent(out, lev);

				if (array_out) {
					print_const("[\n");
				} else {
					print_const("{\n");
				}

				c = t->child;

				while (c) {
					indent(out, lev + 1);

					if (!array_out) {
						print_const("\"");
						text = stack_peek_index(s, count);
						print(text);
						print_const("\": ");
					}

					export_token_to_json(out, c, source, lev, s, array_out);

					count++;
					c = c->next;
				}

				indent(out, lev);

				if (array_out) {
					print_const("]");
				} else {
					print_const("}");
				}

				if (t->next && t->next->type == TDP_RECORD) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD_NUMERIC:
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD:
				print_const("\"");
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);
				print_const("\"");

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TEXT_PLAIN:
			case TEXT_NUMERIC:
			case FIELD_DELIMITER:
				print_token(t);
				break;

			case RECORD_DELIMITER:
				switch (source[t->start]) {
					case '\n':
					case '\r':
						print_const("\\n");
						break;
				}

				break;

			case NEEDS_ESCAPE:
				switch (source[t->start]) {
					case '\b':
						print_const("\\b");
						break;

					case '\f':
						print_const("\\f");
						break;

					case '\n':
						print_const("\\n");
						break;

					case '\r':
						print_const("\\r");
						break;

					case '\t':
						print_const("\\t");
						break;

					case '\"':
						print_const("\\\"");
						break;

					case '\\':
						print_const("\\\\");
						break;

				}

				break;

			case TDP_EMPTY_STRING:
				break;

			case ESCAPED_ESCAPE:
				// TODO: Customize
				print_const("\\\"");
				break;

			default:
				fprintf(stderr, "Error parsing token type %d\n", t->type);
				break;
		}
	}
}